

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_rle_bp_encoder.hpp
# Opt level: O3

void __thiscall duckdb::RleBpEncoder::WriteCurrentBlockBP(RleBpEncoder *this,WriteStream *writer)

{
  byte bVar1;
  RleBpEncoder *pRVar2;
  ulong uVar3;
  uint32_t *in;
  ulong uVar4;
  undefined1 local_41;
  WriteStream *local_40;
  RleBpEncoder *local_38;
  
  local_41 = 0x41;
  local_40 = writer;
  (**writer->_vptr_WriteStream)(writer,&local_41,1);
  in = this->bp_block;
  bVar1 = (byte)this->bit_width;
  uVar4 = 0xffffffffffffffe0;
  uVar3 = 0;
  local_38 = this;
  do {
    duckdb_fastpforlib::fastpack
              (in,(uint32_t *)((uVar3 >> 3) + (long)this->bp_block_packed),(uint)bVar1);
    pRVar2 = local_38;
    uVar4 = uVar4 + 0x20;
    in = in + 0x20;
    uVar3 = uVar3 + (ulong)bVar1 * 0x20;
  } while (uVar4 < 0xe0);
  (**local_40->_vptr_WriteStream)(local_40,this->bp_block_packed,(ulong)local_38->bit_width << 5);
  pRVar2->bp_block_count = 0;
  return;
}

Assistant:

void WriteCurrentBlockBP(WriteStream &writer) {
		ParquetDecodeUtils::VarintEncode(BP_BLOCK_SIZE / 8 << 1 | 1, writer); // (... | 1) signals BP run
		ParquetDecodeUtils::BitPackAligned(bp_block, data_ptr_cast(bp_block_packed), BP_BLOCK_SIZE, bit_width);
		writer.WriteData(data_ptr_cast(bp_block_packed), BP_BLOCK_SIZE * bit_width / 8);
		bp_block_count = 0;
	}